

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void xPredIntraAngAdi_XY_20(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  undefined1 *__src;
  pel first_line [192];
  undefined8 uStack_f0;
  undefined1 local_e8 [192];
  
  uVar5 = iHeight * 2 - 1;
  uVar6 = (iWidth + iHeight * 2) - 2;
  pbVar8 = pSrc + -(long)iHeight;
  if ((int)uVar5 < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pbVar1 = pbVar8 + -1;
      bVar2 = *pbVar8;
      bVar3 = pbVar8[1];
      bVar4 = pbVar8[2];
      pbVar8 = pbVar8 + 1;
      local_e8[uVar7] =
           (char)((uint)*pbVar1 + (uint)bVar4 + ((uint)bVar3 + (uint)bVar2) * 3 + 4 >> 3);
      local_e8[uVar7 + 1] = (char)((uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2);
      uVar7 = uVar7 + 2;
    } while (uVar7 < uVar5);
  }
  if ((int)uVar7 <= (int)uVar6) {
    lVar9 = -1;
    do {
      local_e8[lVar9 + (uVar7 & 0xffffffff)] =
           (char)((uint)pbVar8[lVar9] + (uint)pbVar8[lVar9 + 1] * 2 + (uint)pbVar8[lVar9 + 2] + 2 >>
                 2);
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar6 - (uVar7 & 0xffffffff) != lVar9);
  }
  if (0 < iHeight) {
    __src = local_e8 + (long)(int)uVar5 + -1;
    do {
      uStack_f0 = 0x11cb35;
      memcpy(dst,__src,(long)iWidth);
      __src = __src + -2;
      dst = dst + i_dst;
      iHeight = iHeight + -1;
    } while (iHeight != 0);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_20(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[64 + 128]);
    int left_size = (iHeight - 1) * 2 + 1;
    int top_size = iWidth - 1;
    int line_size = left_size + top_size;
    int i;
    pel *pfirst = first_line + left_size - 1;

    pSrc -= iHeight;

    for (i = 0; i < left_size; i += 2, pSrc++) {
        first_line[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        first_line[i + 1] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
    }
    i--;

    for (; i < line_size; i++, pSrc++) {
        first_line[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst, iWidth * sizeof(pel));
        pfirst -= 2;
        dst += i_dst;
    }
}